

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# om.h
# Opt level: O2

ostream * om::net::operator<<(ostream *os_,mac_addr *a_)

{
  ostream *poVar1;
  string local_30;
  
  mac_addr::to_string_abi_cxx11_(&local_30,a_);
  poVar1 = std::operator<<(os_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os_, mac_addr& a_)
			{
				return (os_ << a_.to_string());
			}